

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O1

drwav_uint64
drwav_read_pcm_frames_s16__ima(drwav *pWav,drwav_uint64 framesToRead,drwav_int16 *pBufferOut)

{
  byte bVar1;
  ushort uVar2;
  int iVar3;
  ulong uVar4;
  size_t sVar5;
  drwav_uint64 dVar6;
  uint uVar7;
  drwav_int32 *pdVar8;
  int iVar9;
  drwav_uint32 *pdVar10;
  drwav_uint32 dVar11;
  drwav_uint32 *pdVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  drwav_int32 dVar17;
  drwav_uint64 dVar18;
  uint uVar19;
  drwav_uint32 *pdVar20;
  int iVar21;
  drwav_uint32 *pdVar22;
  ulong uVar23;
  bool bVar24;
  drwav_uint8 header [4];
  byte local_80 [4];
  byte local_7c;
  byte local_7b;
  byte local_7a;
  drwav_uint32 *local_78;
  drwav_uint32 *local_70;
  drwav_uint64 local_68;
  drwav_int16 *local_60;
  drwav_uint32 *local_58;
  drwav_uint32 *local_50;
  drwav_int32 *local_48;
  undefined8 local_40;
  drwav_uint64 local_38;
  
  if (framesToRead == 0) {
    pdVar12 = (drwav_uint32 *)0x0;
  }
  else {
    pdVar20 = &(pWav->ima).cachedFrameCount;
    local_48 = (pWav->ima).cachedFrames;
    pdVar12 = (drwav_uint32 *)0x0;
    while ((pWav->compressed).iCurrentPCMFrame < pWav->totalPCMFrameCount) {
      if ((*pdVar20 == 0) && ((pWav->ima).bytesRemainingInBlock == 0)) {
        if (pWav->channels == 1) {
          sVar5 = (*pWav->onRead)(pWav->pUserData,local_80,4);
          if (sVar5 == 4) {
            dVar11 = (pWav->fmt).blockAlign - 4;
            (pWav->ima).bytesRemainingInBlock = dVar11;
            if (local_80[2] < 0x59) {
              uVar7 = (int)(short)((ushort)local_80[1] << 8) | (uint)local_80[0];
              (pWav->ima).predictor[0] = uVar7;
              (pWav->ima).stepIndex[0] = (uint)local_80[2];
              goto LAB_00106079;
            }
LAB_00106017:
            (*pWav->onSeek)(pWav->pUserData,dVar11,drwav_seek_origin_current);
            (pWav->ima).bytesRemainingInBlock = 0;
          }
LAB_0010602d:
          bVar24 = false;
          local_78 = pdVar12;
        }
        else {
          sVar5 = (*pWav->onRead)(pWav->pUserData,local_80,8);
          if (sVar5 != 8) goto LAB_0010602d;
          dVar11 = (pWav->fmt).blockAlign - 8;
          (pWav->ima).bytesRemainingInBlock = dVar11;
          if (0x58 < local_7a || 0x58 < local_80[2]) goto LAB_00106017;
          uVar15 = (int)(short)((ushort)local_80[1] << 8) | (uint)local_80[0];
          (pWav->ima).predictor[0] = uVar15;
          (pWav->ima).stepIndex[0] = (uint)local_80[2];
          uVar7 = (int)(short)((ushort)local_7b << 8) | (uint)local_7c;
          (pWav->ima).predictor[1] = uVar7;
          (pWav->ima).stepIndex[1] = (uint)local_7a;
          (pWav->ima).cachedFrames[0xe] = uVar15;
LAB_00106079:
          (pWav->ima).cachedFrames[0xf] = uVar7;
          (pWav->ima).cachedFrameCount = 1;
          bVar24 = true;
        }
        if (!bVar24) {
          return (drwav_uint64)local_78;
        }
      }
      uVar7 = *pdVar20;
      uVar23 = (ulong)uVar7;
      dVar6 = framesToRead - uVar23;
      pdVar22 = (drwav_uint32 *)(uVar23 + (long)pdVar12);
      pdVar10 = pdVar12;
      dVar18 = framesToRead;
      while (bVar24 = uVar7 != 0, uVar7 = uVar7 - 1, local_70 = pdVar12, local_68 = framesToRead,
            bVar24) {
        uVar4 = (pWav->compressed).iCurrentPCMFrame;
        if (pWav->totalPCMFrameCount <= uVar4) {
          pdVar22 = pdVar10;
          dVar6 = dVar18;
          if ((int)uVar23 != 0) goto LAB_001063e3;
          break;
        }
        if (pBufferOut == (drwav_int16 *)0x0) {
          pBufferOut = (drwav_int16 *)0x0;
        }
        else {
          uVar16 = (ulong)pWav->channels;
          if (pWav->channels != 0) {
            uVar13 = 0;
            do {
              pBufferOut[uVar13] = (drwav_int16)pdVar20[uVar13 - (uint)((int)uVar16 * (int)uVar23)];
              uVar13 = uVar13 + 1;
              uVar16 = (ulong)pWav->channels;
            } while (uVar13 < uVar16);
          }
          pBufferOut = pBufferOut + uVar16;
        }
        pdVar10 = (drwav_uint32 *)((long)pdVar10 + 1);
        (pWav->compressed).iCurrentPCMFrame = uVar4 + 1;
        (pWav->ima).cachedFrameCount = uVar7;
        uVar23 = (ulong)uVar7;
        dVar18 = dVar18 - 1;
        if (dVar18 == 0) {
          return framesToRead + (long)pdVar12;
        }
      }
      pdVar10 = pdVar22;
      dVar18 = dVar6;
      if (((pWav->ima).bytesRemainingInBlock != 0) &&
         ((pWav->ima).cachedFrameCount = 8, pWav->channels != 0)) {
        local_68 = 0x10;
        uVar23 = 0;
        local_70 = pdVar20;
        local_60 = pBufferOut;
        local_58 = pdVar22;
        local_50 = pdVar20;
        local_38 = dVar6;
        do {
          sVar5 = (*pWav->onRead)(pWav->pUserData,local_80,4);
          if (sVar5 == 4) {
            (pWav->ima).bytesRemainingInBlock = (pWav->ima).bytesRemainingInBlock - 4;
            uVar2 = pWav->channels;
            pdVar8 = local_48 + uVar2 + local_68;
            lVar14 = 0;
            pdVar12 = local_70;
            do {
              bVar1 = local_80[lVar14];
              uVar19 = (uint)bVar1;
              uVar15 = uVar19 & 0xf;
              iVar3 = (pWav->ima).stepIndex[uVar23];
              uVar7 = drwav_read_pcm_frames_s16__ima::stepTable[iVar3];
              iVar21 = ((int)(uVar15 << 0x1d) >> 0x1f & uVar7) +
                       ((int)uVar7 >> 1 & (int)(uVar15 << 0x1e) >> 0x1f) +
                       ((int)uVar7 >> 2 & -(uVar19 & 1)) + ((int)uVar7 >> 3);
              iVar9 = -iVar21;
              if ((byte)uVar15 < 8) {
                iVar9 = iVar21;
              }
              uVar7 = iVar9 + (pWav->ima).predictor[uVar23];
              if (0x7ffe < (int)uVar7) {
                uVar7 = 0x7fff;
              }
              if ((int)uVar7 < -0x7fff) {
                uVar7 = 0xffff8000;
              }
              (pWav->ima).predictor[uVar23] = uVar7;
              dVar17 = iVar3 + drwav_read_pcm_frames_s16__ima::indexTable[uVar15];
              if (0x57 < dVar17) {
                dVar17 = 0x58;
              }
              if (dVar17 < 1) {
                dVar17 = 0;
              }
              (pWav->ima).stepIndex[uVar23] = dVar17;
              pdVar12[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = uVar7;
              iVar3 = (pWav->ima).stepIndex[uVar23];
              uVar7 = drwav_read_pcm_frames_s16__ima::stepTable[iVar3];
              iVar21 = ((int)(uVar19 << 0x19) >> 0x1f & uVar7) + ((int)uVar7 >> 3) +
                       ((int)uVar7 >> 2 & -(uint)((bVar1 >> 4 & 1) != 0)) +
                       ((int)uVar7 >> 1 & (int)(uVar19 << 0x1a) >> 0x1f);
              iVar9 = -iVar21;
              if (-1 < (char)bVar1) {
                iVar9 = iVar21;
              }
              iVar9 = iVar9 + (pWav->ima).predictor[uVar23];
              if (0x7ffe < iVar9) {
                iVar9 = 0x7fff;
              }
              if (iVar9 < -0x7fff) {
                iVar9 = -0x8000;
              }
              (pWav->ima).predictor[uVar23] = iVar9;
              dVar17 = iVar3 + drwav_read_pcm_frames_s16__ima::indexTable[bVar1 >> 4];
              if (0x57 < dVar17) {
                dVar17 = 0x58;
              }
              if (dVar17 < 1) {
                dVar17 = 0;
              }
              (pWav->ima).stepIndex[uVar23] = dVar17;
              pdVar8[-(ulong)((pWav->ima).cachedFrameCount * (uint)uVar2)] = iVar9;
              lVar14 = lVar14 + 1;
              pdVar8 = (drwav_int32 *)((long)pdVar8 + (ulong)((uint)uVar2 * 8));
              pdVar12 = (drwav_uint32 *)((long)pdVar12 + (ulong)((uint)uVar2 * 8));
            } while (lVar14 != 4);
            local_40 = 4;
            pdVar22 = local_58;
            pdVar20 = local_50;
          }
          else {
            *pdVar20 = 0;
            local_78 = pdVar22;
          }
          if (sVar5 != 4) {
            return (drwav_uint64)local_78;
          }
          uVar23 = uVar23 + 1;
          local_68 = local_68 + 1;
          local_70 = local_70 + 1;
          pdVar10 = pdVar22;
          dVar18 = local_38;
          pBufferOut = local_60;
        } while (uVar23 < pWav->channels);
      }
LAB_001063e3:
      framesToRead = dVar18;
      pdVar12 = pdVar10;
      if (framesToRead == 0) {
        return (drwav_uint64)pdVar12;
      }
    }
  }
  return (drwav_uint64)pdVar12;
}

Assistant:

static drwav_uint64 drwav_read_pcm_frames_s16__ima(drwav* pWav, drwav_uint64 framesToRead, drwav_int16* pBufferOut)
{
    drwav_uint64 totalFramesRead = 0;
    drwav_uint32 iChannel;

    static drwav_int32 indexTable[16] = {
        -1, -1, -1, -1, 2, 4, 6, 8,
        -1, -1, -1, -1, 2, 4, 6, 8
    };

    static drwav_int32 stepTable[89] = {
        7,     8,     9,     10,    11,    12,    13,    14,    16,    17, 
        19,    21,    23,    25,    28,    31,    34,    37,    41,    45, 
        50,    55,    60,    66,    73,    80,    88,    97,    107,   118, 
        130,   143,   157,   173,   190,   209,   230,   253,   279,   307,
        337,   371,   408,   449,   494,   544,   598,   658,   724,   796,
        876,   963,   1060,  1166,  1282,  1411,  1552,  1707,  1878,  2066, 
        2272,  2499,  2749,  3024,  3327,  3660,  4026,  4428,  4871,  5358,
        5894,  6484,  7132,  7845,  8630,  9493,  10442, 11487, 12635, 13899, 
        15289, 16818, 18500, 20350, 22385, 24623, 27086, 29794, 32767 
    };

    DRWAV_ASSERT(pWav != NULL);
    DRWAV_ASSERT(framesToRead > 0);

    /* TODO: Lots of room for optimization here. */

    while (framesToRead > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
        /* If there are no cached samples we need to load a new block. */
        if (pWav->ima.cachedFrameCount == 0 && pWav->ima.bytesRemainingInBlock == 0) {
            if (pWav->channels == 1) {
                /* Mono. */
                drwav_uint8 header[4];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[0];
                pWav->ima.cachedFrameCount = 1;
            } else {
                /* Stereo. */
                drwav_uint8 header[8];
                if (pWav->onRead(pWav->pUserData, header, sizeof(header)) != sizeof(header)) {
                    return totalFramesRead;
                }
                pWav->ima.bytesRemainingInBlock = pWav->fmt.blockAlign - sizeof(header);

                if (header[2] >= drwav_countof(stepTable) || header[6] >= drwav_countof(stepTable)) {
                    pWav->onSeek(pWav->pUserData, pWav->ima.bytesRemainingInBlock, drwav_seek_origin_current);
                    pWav->ima.bytesRemainingInBlock = 0;
                    return totalFramesRead; /* Invalid data. */
                }

                pWav->ima.predictor[0] = drwav__bytes_to_s16(header + 0);
                pWav->ima.stepIndex[0] = header[2];
                pWav->ima.predictor[1] = drwav__bytes_to_s16(header + 4);
                pWav->ima.stepIndex[1] = header[6];

                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 2] = pWav->ima.predictor[0];
                pWav->ima.cachedFrames[drwav_countof(pWav->ima.cachedFrames) - 1] = pWav->ima.predictor[1];
                pWav->ima.cachedFrameCount = 1;
            }
        }

        /* Output anything that's cached. */
        while (framesToRead > 0 && pWav->ima.cachedFrameCount > 0 && pWav->compressed.iCurrentPCMFrame < pWav->totalPCMFrameCount) {
            if (pBufferOut != NULL) {
                drwav_uint32 iSample;
                for (iSample = 0; iSample < pWav->channels; iSample += 1) {
                    pBufferOut[iSample] = (drwav_int16)pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + iSample];
                }
                pBufferOut += pWav->channels;
            }

            framesToRead    -= 1;
            totalFramesRead += 1;
            pWav->compressed.iCurrentPCMFrame += 1;
            pWav->ima.cachedFrameCount -= 1;
        }

        if (framesToRead == 0) {
            return totalFramesRead;
        }

        /*
        If there's nothing left in the cache, just go ahead and load more. If there's nothing left to load in the current block we just continue to the next
        loop iteration which will trigger the loading of a new block.
        */
        if (pWav->ima.cachedFrameCount == 0) {
            if (pWav->ima.bytesRemainingInBlock == 0) {
                continue;
            } else {
                /*
                From what I can tell with stereo streams, it looks like every 4 bytes (8 samples) is for one channel. So it goes 4 bytes for the
                left channel, 4 bytes for the right channel.
                */
                pWav->ima.cachedFrameCount = 8;
                for (iChannel = 0; iChannel < pWav->channels; ++iChannel) {
                    drwav_uint32 iByte;
                    drwav_uint8 nibbles[4];
                    if (pWav->onRead(pWav->pUserData, &nibbles, 4) != 4) {
                        pWav->ima.cachedFrameCount = 0;
                        return totalFramesRead;
                    }
                    pWav->ima.bytesRemainingInBlock -= 4;

                    for (iByte = 0; iByte < 4; ++iByte) {
                        drwav_uint8 nibble0 = ((nibbles[iByte] & 0x0F) >> 0);
                        drwav_uint8 nibble1 = ((nibbles[iByte] & 0xF0) >> 4);

                        drwav_int32 step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        drwav_int32 predictor = pWav->ima.predictor[iChannel];

                        drwav_int32      diff  = step >> 3;
                        if (nibble0 & 1) diff += step >> 2;
                        if (nibble0 & 2) diff += step >> 1;
                        if (nibble0 & 4) diff += step;
                        if (nibble0 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble0], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+0)*pWav->channels + iChannel] = predictor;


                        step      = stepTable[pWav->ima.stepIndex[iChannel]];
                        predictor = pWav->ima.predictor[iChannel];

                                         diff  = step >> 3;
                        if (nibble1 & 1) diff += step >> 2;
                        if (nibble1 & 2) diff += step >> 1;
                        if (nibble1 & 4) diff += step;
                        if (nibble1 & 8) diff  = -diff;

                        predictor = drwav_clamp(predictor + diff, -32768, 32767);
                        pWav->ima.predictor[iChannel] = predictor;
                        pWav->ima.stepIndex[iChannel] = drwav_clamp(pWav->ima.stepIndex[iChannel] + indexTable[nibble1], 0, (drwav_int32)drwav_countof(stepTable)-1);
                        pWav->ima.cachedFrames[(drwav_countof(pWav->ima.cachedFrames) - (pWav->ima.cachedFrameCount*pWav->channels)) + (iByte*2+1)*pWav->channels + iChannel] = predictor;
                    }
                }
            }
        }
    }

    return totalFramesRead;
}